

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O2

void fillBlock(uint32_t *block,UChar32 start,UChar32 limit,uint32_t value,uint32_t initialValue,
              UBool overwrite)

{
  uint32_t *puVar1;
  
  puVar1 = block + (uint)start;
  if (overwrite == '\0') {
    for (; puVar1 < block + (uint)limit; puVar1 = puVar1 + 1) {
      if (*puVar1 == initialValue) {
        *puVar1 = value;
      }
    }
  }
  else {
    for (; puVar1 < block + (uint)limit; puVar1 = puVar1 + 1) {
      *puVar1 = value;
    }
  }
  return;
}

Assistant:

static void
fillBlock(uint32_t *block, UChar32 start, UChar32 limit,
          uint32_t value, uint32_t initialValue, UBool overwrite) {
    uint32_t *pLimit;

    pLimit=block+limit;
    block+=start;
    if(overwrite) {
        while(block<pLimit) {
            *block++=value;
        }
    } else {
        while(block<pLimit) {
            if(*block==initialValue) {
                *block=value;
            }
            ++block;
        }
    }
}